

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_allocator.hpp
# Opt level: O3

ThreadCache * __thiscall
tcmalloc::FixedAllocator<tcmalloc::ThreadCache>::Alloc(FixedAllocator<tcmalloc::ThreadCache> *this)

{
  void *result;
  ThreadCache *pTVar1;
  
  if (this->inited == false) {
    if (this->construct == false) {
      __assert_fail("construct",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/fixed_allocator.hpp"
                    ,0x18,
                    "T *tcmalloc::FixedAllocator<tcmalloc::ThreadCache>::Alloc() [T = tcmalloc::ThreadCache]"
                   );
    }
    this->area_ = (char *)0x0;
    this->area_free_ = 0;
    this->freelist_ = (void *)0x0;
    this->inited = true;
  }
  else {
    pTVar1 = (ThreadCache *)this->freelist_;
    if (pTVar1 != (ThreadCache *)0x0) {
      this->freelist_ = (void *)pTVar1->size_;
      return pTVar1;
    }
  }
  pTVar1 = AllocFromArea(this);
  return pTVar1;
}

Assistant:

T *Alloc() {
        if (!inited) {
            assert(construct);
            Init();
        }
        if (freelist_ != nullptr) {
            return AllocFromFreeList();
        }
        return AllocFromArea();
    }